

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

char * get_D3D_register_string
                 (Context *ctx,RegisterType regtype,int regnum,char *regnum_str,size_t regnum_size)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  
  switch(regtype) {
  case REG_TYPE_TEMP:
    pcVar3 = "r";
    break;
  case REG_TYPE_INPUT:
    pcVar3 = "v";
    break;
  case REG_TYPE_CONST:
    pcVar3 = "c";
    break;
  case REG_TYPE_ADDRESS:
    pcVar3 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar3 = "a";
    }
    break;
  case REG_TYPE_RASTOUT:
    bVar1 = true;
    if (regnum == 2) {
      pcVar3 = "oPts";
    }
    else if (regnum == 1) {
      pcVar3 = "oFog";
    }
    else if (regnum == 0) {
      pcVar3 = "oPos";
    }
    else {
      pcVar3 = (char *)0x0;
    }
    goto LAB_0011105d;
  case REG_TYPE_ATTROUT:
    pcVar3 = "oD";
    break;
  case REG_TYPE_OUTPUT:
    if ((ctx->shader_type == MOJOSHADER_TYPE_VERTEX) && (2 < ctx->major_ver)) {
      pcVar3 = "o";
    }
    else {
      pcVar3 = "oT";
    }
    break;
  case REG_TYPE_CONSTINT:
    pcVar3 = "i";
    break;
  case REG_TYPE_COLOROUT:
    pcVar3 = "oC";
    break;
  case REG_TYPE_DEPTHOUT:
    bVar1 = true;
    pcVar3 = "oDepth";
    goto LAB_0011105d;
  case REG_TYPE_SAMPLER:
    pcVar3 = "s";
    break;
  default:
    failf(ctx,"%s","unknown register type");
    bVar1 = true;
    pcVar3 = "???";
    goto LAB_0011105d;
  case REG_TYPE_CONSTBOOL:
    pcVar3 = "b";
    break;
  case REG_TYPE_LOOP:
    bVar1 = true;
    pcVar3 = "aL";
    goto LAB_0011105d;
  case REG_TYPE_MISCTYPE:
    pcVar2 = (char *)0x0;
    if (regnum == 1) {
      pcVar2 = "vFace";
    }
    pcVar3 = "vPos";
    if (regnum != 0) {
      pcVar3 = pcVar2;
    }
    bVar1 = true;
    goto LAB_0011105d;
  case REG_TYPE_LABEL:
    pcVar3 = "l";
    break;
  case REG_TYPE_MAX:
    pcVar3 = "p";
  }
  bVar1 = false;
LAB_0011105d:
  if (bVar1) {
    *regnum_str = '\0';
  }
  else {
    snprintf(regnum_str,0x10,"%u",(ulong)(uint)regnum);
  }
  return pcVar3;
}

Assistant:

static const char *get_D3D_register_string(Context *ctx,
                                           RegisterType regtype,
                                           int regnum, char *regnum_str,
                                           size_t regnum_size)
{
    const char *retval = NULL;
    int has_number = 1;

    switch (regtype)
    {
        case REG_TYPE_TEMP:
            retval = "r";
            break;

        case REG_TYPE_INPUT:
            retval = "v";
            break;

        case REG_TYPE_CONST:
            retval = "c";
            break;

        case REG_TYPE_ADDRESS:  // (or REG_TYPE_TEXTURE, same value.)
            retval = shader_is_vertex(ctx) ? "a" : "t";
            break;

        case REG_TYPE_RASTOUT:
            switch ((RastOutType) regnum)
            {
                case RASTOUT_TYPE_POSITION: retval = "oPos"; break;
                case RASTOUT_TYPE_FOG: retval = "oFog"; break;
                case RASTOUT_TYPE_POINT_SIZE: retval = "oPts"; break;
            } // switch
            has_number = 0;
            break;

        case REG_TYPE_ATTROUT:
            retval = "oD";
            break;

        case REG_TYPE_OUTPUT: // (or REG_TYPE_TEXCRDOUT, same value.)
            if (shader_is_vertex(ctx) && shader_version_atleast(ctx, 3, 0))
                retval = "o";
            else
                retval = "oT";
            break;

        case REG_TYPE_CONSTINT:
            retval = "i";
            break;

        case REG_TYPE_COLOROUT:
            retval = "oC";
            break;

        case REG_TYPE_DEPTHOUT:
            retval = "oDepth";
            has_number = 0;
            break;

        case REG_TYPE_SAMPLER:
            retval = "s";
            break;

        case REG_TYPE_CONSTBOOL:
            retval = "b";
            break;

        case REG_TYPE_LOOP:
            retval = "aL";
            has_number = 0;
            break;

        case REG_TYPE_MISCTYPE:
            switch ((const MiscTypeType) regnum)
            {
                case MISCTYPE_TYPE_POSITION: retval = "vPos"; break;
                case MISCTYPE_TYPE_FACE: retval = "vFace"; break;
            } // switch
            has_number = 0;
            break;

        case REG_TYPE_LABEL:
            retval = "l";
            break;

        case REG_TYPE_PREDICATE:
            retval = "p";
            break;

        //case REG_TYPE_TEMPFLOAT16:  // !!! FIXME: don't know this asm string
        default:
            fail(ctx, "unknown register type");
            retval = "???";
            has_number = 0;
            break;
    } // switch

    if (has_number)
        snprintf(regnum_str, regnum_size, "%u", (uint) regnum);
    else
        regnum_str[0] = '\0';

    return retval;
}